

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O2

void __thiscall
Assimp::Blender::Structure::_defaultInitializer<0>::operator()
          (_defaultInitializer<0> *this,CustomData *out,char *param_2)

{
  CustomData local_f0;
  
  memset(&local_f0.super_ElemBase.dna_type,0,0xd8);
  local_f0.super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__CustomData_0072d618;
  local_f0.layers.
  super_vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  .
  super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0.layers.
  super_vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  .
  super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f0.layers.
  super_vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  .
  super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CustomData::operator=(out,&local_f0);
  CustomData::~CustomData(&local_f0);
  return;
}

Assistant:

void operator ()(T& out, const char* = NULL) {
            out = T();
        }